

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t xor_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                     uint16_t *output)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  undefined4 uVar7;
  __m128i *palVar8;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong lVar9;
  uint16_t *puVar10;
  uint uVar11;
  int32_t card_2;
  __m128i *palVar12;
  uint uVar13;
  ulong uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t *out;
  __m128i alVar17;
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i old_02;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  uint16_t buffer [17];
  __m128i vB;
  __m128i vA;
  longlong extraout_RDX_00;
  longlong extraout_RDX_03;
  
  if (length1 < 8 || length2 < 8) {
    uVar2 = xor_uint16(array1,length1,array2,length2,output);
    return uVar2;
  }
  vA = (__m128i)vlddqu_avx(*(undefined1 (*) [16])array1);
  alVar17 = (__m128i)vlddqu_avx(*(undefined1 (*) [16])array2);
  palVar12 = &vB;
  palVar8 = &vecMax;
  puVar10 = output;
  vB = alVar17;
  sse_merge(&vA,palVar12,&vecMin,palVar8);
  vpcmpeqd_avx((undefined1  [16])alVar17,(undefined1  [16])alVar17);
  alVar17[1] = (longlong)palVar8;
  alVar17[0] = extraout_RDX;
  old[1] = (longlong)palVar12;
  old[0] = (longlong)output;
  iVar3 = store_unique_xor(old,alVar17,puVar10);
  out = output + iVar3;
  palVar8 = (__m128i *)CONCAT71((int7)((ulong)palVar8 >> 8),length2 < 0x10 || length1 < 0x10);
  if (length2 >= 0x10 && length1 >= 0x10) {
    uVar16 = array1[8];
    uVar15 = array2[8];
    uVar11 = 1;
    uVar14 = 1;
    do {
      uVar13 = (uint)uVar14;
      if (uVar15 < uVar16) {
        V = (__m128i)vlddqu_avx(*(undefined1 (*) [16])(array2 + uVar14 * 8));
        uVar13 = uVar13 + 1;
        uVar14 = (ulong)uVar13;
        if (length2 >> 3 <= uVar13) goto LAB_0010414a;
        uVar15 = array2[uVar13 * 8];
      }
      else {
        V = (__m128i)vlddqu_avx(*(undefined1 (*) [16])(array1 + (ulong)uVar11 * 8));
        uVar11 = uVar11 + 1;
        if (length1 >> 3 <= uVar11) goto LAB_0010414a;
        uVar16 = array1[uVar11 * 8];
      }
      palVar8 = &vecMax;
      palVar12 = &vecMax;
      sse_merge(&V,&vecMax,&vecMin,&vecMax);
      newval[1] = (longlong)palVar8;
      newval[0] = extraout_RDX_01;
      old_00[1] = (longlong)palVar12;
      old_00[0] = (longlong)out;
      iVar3 = store_unique_xor(old_00,newval,puVar10);
      out = out + iVar3;
    } while( true );
  }
  uVar13 = 8;
  uVar11 = 1;
  lVar9 = extraout_RDX_00;
LAB_00104194:
  newval_01[1] = (longlong)palVar8;
  newval_01[0] = lVar9;
  old_02[1] = (longlong)palVar12;
  old_02[0] = (longlong)buffer;
  iVar3 = store_unique_xor(old_02,newval_01,puVar10);
  auVar1._8_8_ = vecMax[1];
  auVar1._0_8_ = vecMax[0];
  uVar7 = vpextrw_avx(auVar1,7);
  uVar4 = vpextrw_avx(auVar1,6);
  if ((uint16_t)uVar7 != (uint16_t)uVar4) {
    lVar6 = (long)iVar3;
    iVar3 = iVar3 + 1;
    buffer[lVar6] = (uint16_t)uVar7;
  }
  if (uVar11 == length1 >> 3) {
    memcpy(buffer + iVar3,array1 + (length1 & 0xfffffff8),(ulong)((length1 & 7) * 2));
    uVar2 = iVar3 + (length1 & 7);
    if (uVar2 == 0) {
      uVar5 = length2 - uVar13;
      memcpy(out,array2 + uVar13,(ulong)uVar5 * 2);
      goto LAB_00104318;
    }
    qsort(buffer,(long)(int)uVar2,2,uint16_compare);
    uVar2 = unique_xor(buffer,uVar2);
    puVar10 = array2 + uVar13;
    card_2 = length2 - uVar13;
  }
  else {
    memcpy(buffer + iVar3,array2 + uVar13,(ulong)((length2 & 7) * 2));
    uVar2 = iVar3 + (length2 & 7);
    if (uVar2 == 0) {
      uVar5 = length1 + uVar11 * -8;
      memcpy(out,array1 + uVar11 * 8,(ulong)uVar5 * 2);
      goto LAB_00104318;
    }
    qsort(buffer,(long)(int)uVar2,2,uint16_compare);
    uVar2 = unique_xor(buffer,uVar2);
    puVar10 = array1 + uVar11 * 8;
    card_2 = length1 + uVar11 * -8;
  }
  uVar5 = xor_uint16(buffer,uVar2,puVar10,card_2,out);
LAB_00104318:
  return uVar5 + (int)((ulong)((long)out - (long)output) >> 1);
LAB_0010414a:
  palVar8 = &vecMax;
  palVar12 = palVar8;
  sse_merge(&V,palVar8,&vecMin,palVar8);
  newval_00[1] = (longlong)palVar8;
  newval_00[0] = extraout_RDX_02;
  old_01[1] = (longlong)palVar12;
  old_01[0] = (longlong)out;
  iVar3 = store_unique_xor(old_01,newval_00,puVar10);
  out = out + iVar3;
  uVar13 = uVar13 << 3;
  lVar9 = extraout_RDX_03;
  goto LAB_00104194;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE xor algorithm
uint32_t xor_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                      const uint16_t *__restrict__ array2, uint32_t length2,
                      uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return xor_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    uint16_t buffer[17];
    output += store_unique_xor(laststore, vecMin, output);

    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            // conditionally stores the last value of laststore as well as all
            // but the
            // last value of vecMin
            output += store_unique_xor(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        // conditionally stores the last value of laststore as well as all but
        // the
        // last value of vecMin
        output += store_unique_xor(laststore, vecMin, output);
        laststore = vecMin;
    }
    uint32_t len = (uint32_t)(output - initoutput);

    // we finish the rest off using a scalar algorithm
    // could be improved?
    // conditionally stores the last value of laststore as well as all but the
    // last value of vecMax,
    // we store to "buffer"
    int leftoversize = store_unique_xor(laststore, vecMax, buffer);
    uint16_t vec7 = (uint16_t)_mm_extract_epi16(vecMax, 7);
    uint16_t vec6 = (uint16_t)_mm_extract_epi16(vecMax, 6);
    if (vec7 != vec6) buffer[leftoversize++] = vec7;
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array2 + 8 * pos2,
                   (length2 - 8 * pos2) * sizeof(uint16_t));
            len += (length2 - 8 * pos2);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array2 + 8 * pos2,
                              length2 - 8 * pos2, output);
        }
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array1 + 8 * pos1,
                   (length1 - 8 * pos1) * sizeof(uint16_t));
            len += (length1 - 8 * pos1);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array1 + 8 * pos1,
                              length1 - 8 * pos1, output);
        }
    }
    return len;
}